

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::resolveProcessorInstance
          (QualifiedIdentifierResolver *this,CallOrCast *call,ProcessorBase *p)

{
  pointer ppVar1;
  pointer ppVar2;
  size_t sVar3;
  pool_ptr<soul::AST::Expression> local_28;
  
  ppVar1 = (p->super_ModuleBase).specialisationParams.
           super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (p->super_ModuleBase).specialisationParams.
           super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = AST::CallOrCastBase::getNumArguments(&call->super_CallOrCastBase);
  if ((long)ppVar1 - (long)ppVar2 >> 3 == sVar3) {
    local_28.object = &((call->super_CallOrCastBase).arguments.object)->super_Expression;
    call = (CallOrCast *)
           getOrCreateImplicitProcessorInstance
                     (this,&(call->super_CallOrCastBase).super_Expression.super_Statement.
                            super_ASTObject.context,p,&local_28);
  }
  return (Expression *)call;
}

Assistant:

AST::Expression& resolveProcessorInstance (AST::CallOrCast& call, AST::ProcessorBase& p)
        {
            if (p.specialisationParams.size() == call.getNumArguments())
                return getOrCreateImplicitProcessorInstance (call.context, p, call.arguments);

            return call;
        }